

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaLoader::CreateAnimation
          (ColladaLoader *this,aiScene *pScene,ColladaParser *pParser,Animation *pSrcAnim,
          string *pName)

{
  pointer *pppaVar1;
  long *plVar2;
  size_t *psVar3;
  undefined8 *puVar4;
  pointer pTVar5;
  long lVar6;
  iterator __position;
  undefined1 auVar7 [16];
  double dVar8;
  bool bVar9;
  float fVar10;
  Accessor **ppAVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  aiNodeAnim **__src;
  iterator iVar14;
  size_type sVar15;
  int iVar16;
  _Base_ptr p_Var17;
  size_t sVar18;
  Node *pNVar19;
  long lVar20;
  Logger *pLVar21;
  Accessor *pAVar22;
  Data *pDVar23;
  ulong uVar24;
  aiNodeAnim *paVar25;
  aiVectorKey *paVar26;
  aiQuatKey *paVar27;
  aiMeshMorphAnim *paVar28;
  ulong *puVar29;
  uint *puVar30;
  double *pdVar31;
  aiAnimation *paVar32;
  aiNodeAnim **__dest;
  aiMeshMorphAnim **__dest_00;
  runtime_error *this_00;
  uint uVar33;
  aiQuatKey *paVar34;
  undefined1 auVar35 [8];
  size_type *psVar36;
  size_t sVar37;
  pointer pCVar38;
  uint uVar39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar40;
  undefined1 auVar41 [8];
  pointer pCVar42;
  ulong uVar43;
  char cVar44;
  uint uVar45;
  ColladaLoader *pCVar46;
  pointer ppaVar47;
  pointer pCVar48;
  pointer ppaVar49;
  ulong uVar50;
  long lVar51;
  string *psVar52;
  size_t a;
  float fVar53;
  ai_real aVar54;
  ai_real aVar55;
  float fVar56;
  float fVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  aiMeshMorphAnim *morphAnim;
  vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_> transforms;
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> entries;
  string subElement;
  vector<aiMeshMorphAnim_*,_std::allocator<aiMeshMorphAnim_*>_> morphAnims;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> resultTrafos;
  string targetID;
  string nodeName;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> nodes;
  aiMatrix4x4 mat;
  aiMeshMorphAnim *local_380;
  undefined1 local_378 [8];
  pointer pMStack_370;
  pointer local_368 [2];
  vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_> local_358;
  float local_33c;
  char *local_338;
  double local_330;
  char local_328;
  char acStack_327 [15];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  ProgressHandler *local_308;
  aiNodeAnim **local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f0;
  Animation *local_2e0;
  ColladaParser *local_2d8;
  ai_real local_2cc;
  undefined1 local_2c8 [8];
  iterator iStack_2c0;
  aiMatrix4x4t<float> *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  pointer local_280;
  _Alloc_hider _Stack_278;
  Accessor *local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_268;
  Data *pDStack_258;
  _Alloc_hider local_250;
  pointer local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  string local_230;
  ColladaLoader *local_210;
  DataLibrary *local_208;
  AccessorLibrary *local_200;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> local_1f8;
  string *local_1d8;
  _Base_ptr local_1d0;
  undefined1 local_1c8 [8];
  aiAnimation *paStack_1c0;
  pointer local_1b8;
  _Base_ptr p_Stack_1b0;
  _Base_ptr local_1a8;
  _Base_ptr p_Stack_1a0;
  pointer local_198;
  undefined8 uStack_190;
  ios_base local_158 [272];
  ai_real local_48;
  
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e0 = pSrcAnim;
  local_1d8 = pName;
  CollectNodes(this,pScene->mRootNode,&local_1f8);
  local_2f8 = (aiNodeAnim **)0x0;
  aStack_2f0._M_allocated_capacity = 0;
  aStack_2f0._8_8_ = (aiNodeAnim **)0x0;
  local_308 = (ProgressHandler *)0x0;
  local_318._M_allocated_capacity = 0;
  local_318._8_8_ = (aiMeshMorphAnim **)0x0;
  local_210 = this;
  if (local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
LAB_0040ba54:
    bVar9 = true;
    if (local_318._M_allocated_capacity == local_318._8_8_) goto LAB_0040bcf4;
  }
  else {
    local_200 = &pParser->mAccessorLibrary;
    local_208 = &pParser->mDataLibrary;
    p_Var17 = (_Base_ptr)
              local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_2d8 = pParser;
    do {
      local_358.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_358.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_358.
      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      paVar32 = *(aiAnimation **)p_Var17;
      puVar30 = (uint *)(paVar32->mName).data;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      local_1d0 = p_Var17;
      sVar18 = strlen((char *)puVar30);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,puVar30,(long)(paVar32->mName).data + sVar18);
      pNVar19 = FindNode(local_210,pParser->mRootNode,&local_230);
      if (pNVar19 != (Node *)0x0) {
        local_250._M_p = (pointer)&local_240;
        local_248 = (pointer)0x0;
        local_240._M_local_buf[0] = '\0';
        local_338 = &local_328;
        local_330 = 0.0;
        local_328 = '\0';
        for (paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_2e0->mChannels).
                          super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            paVar40 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2e0->mChannels).
               super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
               ._M_impl.super__Vector_impl_data._M_finish; paVar40 = paVar40 + 0xc) {
          local_2c8 = (undefined1  [8])0x0;
          iStack_2c0._M_current = (aiMatrix4x4t<float> *)&local_2b0;
          local_2b8 = (aiMatrix4x4t<float> *)0x0;
          local_2b0._M_local_buf[0] = '\0';
          local_2a0._M_allocated_capacity = (size_type)&local_290;
          local_2a0._8_8_ = (_Base_ptr)0x0;
          local_290._M_local_buf[0] = '\0';
          aStack_268._8_8_ = 0;
          pDStack_258 = (Data *)0x0;
          local_270 = (Accessor *)0x0;
          aStack_268._M_allocated_capacity = 0;
          local_280 = (pointer)0x0;
          _Stack_278._M_p = (pointer)0x0;
          cVar44 = (char)paVar40;
          lVar20 = std::__cxx11::string::find(cVar44,0x2f);
          if (lVar20 == -1) {
            lVar20 = std::__cxx11::string::find
                               (paVar40->_M_local_buf,(ulong)(pNVar19->mID)._M_dataplus._M_p,0);
            if (lVar20 != -1) {
              local_2c8 = (undefined1  [8])paVar40;
              std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
              std::__cxx11::string::operator=((string *)&iStack_2c0,(string *)local_1c8);
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
              }
              if (*(char *)iStack_2c0._M_current == '-') {
                std::__cxx11::string::substr((ulong)local_1c8,(ulong)&iStack_2c0);
                std::__cxx11::string::operator=((string *)&iStack_2c0,(string *)local_1c8);
                if (local_1c8 != (undefined1  [8])&local_1b8) {
                  operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                }
              }
              std::
              vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
              ::push_back(&local_358,(value_type *)local_2c8);
            }
          }
          else {
            lVar20 = std::__cxx11::string::find(cVar44,0x2f);
            if (lVar20 == -1) {
              local_248 = (pointer)0x0;
              *local_250._M_p = '\0';
              std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
              std::__cxx11::string::operator=((string *)&local_250,(string *)local_1c8);
              if (local_1c8 != (undefined1  [8])&local_1b8) {
                operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
              }
              if ((local_248 == (pointer)(pNVar19->mID)._M_string_length) &&
                 ((local_248 == (pointer)0x0 ||
                  (iVar16 = bcmp(local_250._M_p,(pNVar19->mID)._M_dataplus._M_p,(size_t)local_248),
                  iVar16 == 0)))) {
                lVar20 = std::__cxx11::string::find(cVar44,0x2e);
                if (lVar20 == -1) {
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=
                            ((string *)local_2a0._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                }
                else {
                  lVar20 = std::__cxx11::string::find(cVar44,0x2e);
                  if (lVar20 != -1) goto LAB_0040a8d0;
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=
                            ((string *)local_2a0._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                  local_330 = 0.0;
                  *local_338 = '\0';
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=((string *)&local_338,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                  iVar16 = std::__cxx11::string::compare((char *)&local_338);
                  if (iVar16 == 0) {
                    _Stack_278._M_p = (pointer)0x3;
                  }
                  else {
                    iVar16 = std::__cxx11::string::compare((char *)&local_338);
                    if (iVar16 == 0) {
                      _Stack_278._M_p = (pointer)0x0;
                    }
                    else {
                      iVar16 = std::__cxx11::string::compare((char *)&local_338);
                      if (iVar16 == 0) {
                        _Stack_278._M_p = (pointer)0x1;
                      }
                      else {
                        iVar16 = std::__cxx11::string::compare((char *)&local_338);
                        if (iVar16 == 0) {
                          _Stack_278._M_p = (pointer)0x2;
                        }
                        else {
                          pLVar21 = DefaultLogger::get();
                          Formatter::
                          basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                          basic_formatter<char[26]>
                                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1c8,(char (*) [26])"Unknown anim subelement <");
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c8,local_338,(long)local_330);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1c8,">. Ignoring",0xb);
                          std::__cxx11::stringbuf::str();
                          Logger::warn(pLVar21,(char *)local_378);
                          if (local_378 != (undefined1  [8])local_368) {
                            operator_delete((void *)local_378,
                                            (ulong)((long)&local_368[0]->mTime + 1));
                          }
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
                          std::ios_base::~ios_base(local_158);
                        }
                      }
                    }
                  }
                }
                lVar20 = std::__cxx11::string::find(cVar44,0x28);
                if (lVar20 != -1) {
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=
                            ((string *)local_2a0._M_local_buf,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                  local_330 = 0.0;
                  *local_338 = '\0';
                  std::__cxx11::string::substr((ulong)local_1c8,(ulong)paVar40);
                  std::__cxx11::string::operator=((string *)&local_338,(string *)local_1c8);
                  if (local_1c8 != (undefined1  [8])&local_1b8) {
                    operator_delete((void *)local_1c8,(ulong)((long)&local_1b8->mChannel + 1));
                  }
                  iVar16 = std::__cxx11::string::compare((char *)&local_338);
                  if (iVar16 == 0) {
                    _Stack_278._M_p = (pointer)0x0;
                  }
                  else {
                    iVar16 = std::__cxx11::string::compare((char *)&local_338);
                    if (iVar16 == 0) {
                      _Stack_278._M_p = (pointer)0x1;
                    }
                    else {
                      iVar16 = std::__cxx11::string::compare((char *)&local_338);
                      if (iVar16 == 0) {
                        _Stack_278._M_p = (pointer)0x2;
                      }
                      else {
                        iVar16 = std::__cxx11::string::compare((char *)&local_338);
                        if (iVar16 == 0) {
                          _Stack_278._M_p = (pointer)0x3;
                        }
                        else {
                          iVar16 = std::__cxx11::string::compare((char *)&local_338);
                          if (iVar16 == 0) {
                            _Stack_278._M_p = (pointer)0x4;
                          }
                          else {
                            iVar16 = std::__cxx11::string::compare((char *)&local_338);
                            if (iVar16 == 0) {
                              _Stack_278._M_p = (pointer)0x5;
                            }
                            else {
                              iVar16 = std::__cxx11::string::compare((char *)&local_338);
                              if (iVar16 == 0) {
                                _Stack_278._M_p = (pointer)0x6;
                              }
                              else {
                                iVar16 = std::__cxx11::string::compare((char *)&local_338);
                                if (iVar16 == 0) {
                                  _Stack_278._M_p = (pointer)0x7;
                                }
                                else {
                                  iVar16 = std::__cxx11::string::compare((char *)&local_338);
                                  if (iVar16 == 0) {
                                    _Stack_278._M_p = (pointer)0x8;
                                  }
                                  else {
                                    iVar16 = std::__cxx11::string::compare((char *)&local_338);
                                    if (iVar16 == 0) {
                                      _Stack_278._M_p = (pointer)0x9;
                                    }
                                    else {
                                      iVar16 = std::__cxx11::string::compare((char *)&local_338);
                                      if (iVar16 == 0) {
                                        _Stack_278._M_p = (pointer)0xa;
                                      }
                                      else {
                                        iVar16 = std::__cxx11::string::compare((char *)&local_338);
                                        if (iVar16 == 0) {
                                          _Stack_278._M_p = (pointer)0xb;
                                        }
                                        else {
                                          iVar16 = std::__cxx11::string::compare((char *)&local_338)
                                          ;
                                          if (iVar16 == 0) {
                                            _Stack_278._M_p = (pointer)0xc;
                                          }
                                          else {
                                            iVar16 = std::__cxx11::string::compare
                                                               ((char *)&local_338);
                                            if (iVar16 == 0) {
                                              _Stack_278._M_p = (pointer)0xd;
                                            }
                                            else {
                                              iVar16 = std::__cxx11::string::compare
                                                                 ((char *)&local_338);
                                              if (iVar16 == 0) {
                                                _Stack_278._M_p = (pointer)0xe;
                                              }
                                              else {
                                                iVar16 = std::__cxx11::string::compare
                                                                   ((char *)&local_338);
                                                if (iVar16 == 0) {
                                                  _Stack_278._M_p = (pointer)0xf;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                uVar13 = local_2a0._8_8_;
                uVar12 = local_2a0._M_allocated_capacity;
                local_280 = (pointer)0xffffffffffffffff;
                pTVar5 = (pNVar19->mTransforms).
                         super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                lVar20 = (long)(pNVar19->mTransforms).
                               super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5;
                if (lVar20 == 0) {
LAB_0040acf8:
                  lVar20 = std::__cxx11::string::find(local_2a0._M_local_buf,0x695fed,0);
                  if (lVar20 == -1) goto LAB_0040a8d0;
                  std::__cxx11::string::_M_assign((string *)&iStack_2c0);
                  std::__cxx11::string::_M_replace
                            ((ulong)&local_2a0,0,(char *)local_2a0._8_8_,0x68cee4);
                }
                else {
                  psVar36 = &(pTVar5->mID)._M_string_length;
                  ppaVar49 = (pointer)0xffffffffffffffff;
                  ppaVar47 = (pointer)0x0;
                  do {
                    if (((_Base_ptr)*psVar36 == (_Base_ptr)uVar13) &&
                       (((_Base_ptr)uVar13 == (_Base_ptr)0x0 ||
                        (iVar16 = bcmp((((string *)(psVar36 + -1))->_M_dataplus)._M_p,(void *)uVar12
                                       ,uVar13), iVar16 == 0)))) {
                      ppaVar49 = ppaVar47;
                      local_280 = ppaVar47;
                    }
                    ppaVar47 = (pointer)((long)ppaVar47 + 1);
                    psVar36 = psVar36 + 0xd;
                  } while (ppaVar47 < (pointer)((lVar20 >> 3) * 0x4ec4ec4ec4ec4ec5));
                  if (ppaVar49 == (pointer)0xffffffffffffffff) goto LAB_0040acf8;
                }
                local_2c8 = (undefined1  [8])paVar40;
                std::
                vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ::push_back(&local_358,(value_type *)local_2c8);
              }
            }
          }
LAB_0040a8d0:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a0._M_allocated_capacity != &local_290) {
            operator_delete((void *)local_2a0._M_allocated_capacity,
                            CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]
                                    ) + 1);
          }
          pParser = local_2d8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)iStack_2c0._M_current != &local_2b0) {
            operator_delete(iStack_2c0._M_current,
                            CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]
                                    ) + 1);
          }
        }
        if (local_358.
            super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_358.
            super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          fVar10 = 1e+20;
          pCVar38 = local_358.
                    super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pAVar22 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                (pParser,local_200,&pCVar38->mChannel->mSourceTimes);
            pCVar38->mTimeAccessor = pAVar22;
            pDVar23 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                                (pParser,local_208,&pAVar22->mSource);
            pCVar38->mTimeData = pDVar23;
            pAVar22 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                (pParser,local_200,&pCVar38->mChannel->mSourceValues);
            pCVar38->mValueAccessor = pAVar22;
            pDVar23 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                                (pParser,local_208,&pAVar22->mSource);
            pCVar38->mValueData = pDVar23;
            pAVar22 = pCVar38->mTimeAccessor;
            sVar37 = pAVar22->mCount;
            if (sVar37 != pCVar38->mValueAccessor->mCount) {
LAB_0040bd63:
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,
                         "Time count / value count mismatch in animation channel \"",0x38);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1c8,(pCVar38->mChannel->mTarget)._M_dataplus._M_p,
                         (pCVar38->mChannel->mTarget)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\".",2);
              std::__cxx11::stringbuf::str();
              std::runtime_error::runtime_error(this_00,(string *)local_2c8);
              *(undefined ***)this_00 = &PTR__runtime_error_007da4b8;
              __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            if (sVar37 != 0) {
              pDVar23 = pCVar38->mTimeData;
              pCVar46 = (ColladaLoader *)
                        (pDVar23->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl
                        .super__Vector_impl_data._M_start;
              if ((ulong)((long)(pDVar23->mValues).super__Vector_base<float,_std::allocator<float>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar46 >> 2) <=
                  pAVar22->mOffset) {
                __assert_fail("pos < pData.mValues.size()",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaLoader.cpp"
                              ,0x74a,
                              "ai_real Assimp::ColladaLoader::ReadFloat(const Collada::Accessor &, const Collada::Data &, size_t, size_t) const"
                             );
              }
              fVar53 = *(float *)((long)&(pCVar46->super_BaseImporter)._vptr_BaseImporter +
                                 pAVar22->mOffset * 4);
              if (fVar10 <= fVar53) {
                fVar53 = fVar10;
              }
              ReadFloat(pCVar46,pAVar22,pDVar23,sVar37 - 1,0);
              fVar10 = fVar53;
            }
            pCVar38 = pCVar38 + 1;
          } while (pCVar38 !=
                   local_358.
                   super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          local_2c8 = (undefined1  [8])0x0;
          iStack_2c0._M_current = (aiMatrix4x4t<float> *)0x0;
          local_2b8 = (aiMatrix4x4t<float> *)0x0;
          if ((pCVar38 ==
               local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start) ||
             ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount == 0)) {
LAB_0040b52d:
            pLVar21 = DefaultLogger::get();
            Logger::warn(pLVar21,
                         "Collada loader: found empty animation channel, ignored. Please check your exporter."
                        );
          }
          else {
            pCVar46 = (ColladaLoader *)local_378;
            std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
            vector((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                    *)local_378,&pNVar19->mTransforms);
            pCVar38 = local_358.
                      super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            do {
              pCVar48 = local_358.
                        super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_358.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start != pCVar38) {
                do {
                  pAVar22 = pCVar48->mTimeAccessor;
                  if (pAVar22->mCount == 0) {
                    fVar53 = 0.0;
                    uVar24 = 0xffffffffffffffff;
                    uVar50 = 0;
                  }
                  else {
                    uVar50 = 0;
                    do {
                      fVar53 = ReadFloat(pCVar46,pAVar22,pCVar48->mTimeData,uVar50,0);
                      pAVar22 = pCVar48->mTimeAccessor;
                      if (fVar10 <= fVar53) break;
                      uVar50 = uVar50 + 1;
                    } while (uVar50 < pAVar22->mCount);
                    uVar24 = pAVar22->mCount - 1;
                  }
                  if (uVar24 < uVar50) {
                    uVar50 = uVar24;
                  }
                  pAVar22 = pCVar48->mValueAccessor;
                  if (pAVar22->mSize == 0) {
                    uVar24 = 0;
                  }
                  else {
                    sVar37 = 0;
                    do {
                      aVar54 = ReadFloat(pCVar46,pAVar22,pCVar48->mValueData,uVar50,sVar37);
                      *(ai_real *)(local_1c8 + sVar37 * 4) = aVar54;
                      sVar37 = sVar37 + 1;
                      pAVar22 = pCVar48->mValueAccessor;
                      uVar24 = pAVar22->mSize;
                    } while (sVar37 < uVar24);
                  }
                  if ((fVar53 <= fVar10) || (uVar50 == 0)) {
LAB_0040affc:
                    if (uVar24 != 0) {
                      pCVar46 = (ColladaLoader *)
                                (((aiString *)local_378)->data +
                                pCVar48->mSubElement * 4 + pCVar48->mTransformIndex * 0x68 + 0x20);
                      memcpy(pCVar46,local_1c8,uVar24 << 2);
                    }
                  }
                  else {
                    aVar54 = ReadFloat(pCVar46,pCVar48->mTimeAccessor,pCVar48->mTimeData,uVar50 - 1,
                                       0);
                    pAVar22 = pCVar48->mValueAccessor;
                    if (pAVar22->mSize != 0) {
                      sVar37 = 0;
                      do {
                        aVar55 = ReadFloat(pCVar46,pAVar22,pCVar48->mValueData,uVar50 - 1,sVar37);
                        *(float *)(local_1c8 + sVar37 * 4) =
                             (aVar55 - *(float *)(local_1c8 + sVar37 * 4)) *
                             ((fVar10 - fVar53) / (aVar54 - fVar53)) +
                             *(float *)(local_1c8 + sVar37 * 4);
                        sVar37 = sVar37 + 1;
                        pAVar22 = pCVar48->mValueAccessor;
                        uVar24 = pAVar22->mSize;
                      } while (sVar37 < uVar24);
                      goto LAB_0040affc;
                    }
                  }
                  pCVar48 = pCVar48 + 1;
                } while (pCVar48 !=
                         local_358.
                         super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              pParser = local_2d8;
              pCVar46 = (ColladaLoader *)local_1c8;
              ColladaParser::CalculateResultTransform
                        ((aiMatrix4x4 *)local_1c8,local_2d8,
                         (vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                          *)local_378);
              uStack_190 = (pointer)CONCAT44(fVar10,(float)uStack_190);
              if (iStack_2c0._M_current == local_2b8) {
                pCVar46 = (ColladaLoader *)local_2c8;
                std::vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>>::
                _M_realloc_insert<aiMatrix4x4t<float>const&>
                          ((vector<aiMatrix4x4t<float>,std::allocator<aiMatrix4x4t<float>>> *)
                           pCVar46,iStack_2c0,(aiMatrix4x4t<float> *)local_1c8);
              }
              else {
                *(pointer *)&(iStack_2c0._M_current)->d1 = local_198;
                *(pointer *)&(iStack_2c0._M_current)->d3 = uStack_190;
                *(_Base_ptr *)&(iStack_2c0._M_current)->c1 = local_1a8;
                *(_Base_ptr *)&(iStack_2c0._M_current)->c3 = p_Stack_1a0;
                *(pointer *)&(iStack_2c0._M_current)->b1 = local_1b8;
                *(_Base_ptr *)&(iStack_2c0._M_current)->b3 = p_Stack_1b0;
                (iStack_2c0._M_current)->a1 = (float)local_1c8._0_4_;
                (iStack_2c0._M_current)->a2 = (float)local_1c8._4_4_;
                *(aiAnimation **)&(iStack_2c0._M_current)->a3 = paStack_1c0;
                iStack_2c0._M_current = iStack_2c0._M_current + 1;
              }
              pCVar38 = local_358.
                        super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_358.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_358.
                  super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                fVar53 = 1e+20;
              }
              else {
                fVar53 = 1e+20;
                do {
                  pAVar22 = pCVar38->mTimeAccessor;
                  if (pAVar22->mCount == 0) {
                    uVar50 = 0;
                    fVar56 = fVar53;
                  }
                  else {
                    uVar50 = 0;
                    do {
                      fVar56 = ReadFloat(pCVar46,pAVar22,pCVar38->mTimeData,uVar50,0);
                      if (fVar10 < fVar56) {
                        if (fVar53 <= fVar56) {
                          fVar56 = fVar53;
                        }
                        break;
                      }
                      uVar50 = uVar50 + 1;
                      pAVar22 = pCVar38->mTimeAccessor;
                      fVar56 = fVar53;
                    } while (uVar50 < pAVar22->mCount);
                  }
                  fVar53 = fVar56;
                  if ((((*(int *)(((aiString *)local_378)->data +
                                 pCVar38->mTransformIndex * 0x68 + 0x1c) == 1) && (uVar50 != 0)) &&
                      (pCVar38->mSubElement == 3)) && (uVar50 < pCVar38->mTimeAccessor->mCount)) {
                    local_48 = ReadFloat(pCVar46,pCVar38->mValueAccessor,pCVar38->mValueData,uVar50,
                                         0);
                    local_2cc = ReadFloat(pCVar46,pCVar38->mValueAccessor,pCVar38->mValueData,
                                          uVar50 - 1,0);
                    local_33c = ReadFloat(pCVar46,pCVar38->mTimeAccessor,pCVar38->mTimeData,uVar50,0
                                         );
                    aVar54 = ReadFloat(pCVar46,pCVar38->mTimeAccessor,pCVar38->mTimeData,uVar50 - 1,
                                       0);
                    fVar57 = ABS(local_48 -
                                 (((fVar10 - aVar54) * (local_48 - local_2cc)) /
                                  (local_33c - aVar54) + local_2cc));
                    if (180.0 <= fVar57) {
                      if ((local_33c != fVar10) || (NAN(local_33c) || NAN(fVar10))) {
                        dVar8 = floor((double)fVar57 / 90.0);
                        fVar53 = (local_33c - fVar10) / (float)(int)dVar8 + fVar10;
                        if (fVar56 <= fVar53) {
                          fVar53 = fVar56;
                        }
                      }
                    }
                  }
                  pCVar38 = pCVar38 + 1;
                } while (pCVar38 !=
                         local_358.
                         super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              fVar10 = fVar53;
            } while (fVar10 <= 1e+19);
            std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::
            ~vector((vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                     *)local_378);
            iVar14._M_current = iStack_2c0._M_current;
            auVar41 = local_2c8;
            if (local_2c8 == (undefined1  [8])iStack_2c0._M_current) goto LAB_0040b52d;
            paVar25 = (aiNodeAnim *)operator_new(0x438);
            (paVar25->mNodeName).length = 0;
            (paVar25->mNodeName).data[0] = '\0';
            memset((paVar25->mNodeName).data + 1,0x1b,0x3ff);
            sVar15 = local_230._M_string_length;
            paVar25->mRotationKeys = (aiQuatKey *)0x0;
            paVar25->mNumScalingKeys = 0;
            *(undefined8 *)&paVar25->mNumPositionKeys = 0;
            *(undefined8 *)((long)&paVar25->mPositionKeys + 4) = 0;
            paVar25->mScalingKeys = (aiVectorKey *)0x0;
            paVar25->mPreState = aiAnimBehaviour_DEFAULT;
            paVar25->mPostState = aiAnimBehaviour_DEFAULT;
            local_378 = (undefined1  [8])paVar25;
            if (local_230._M_string_length < (pointer)0x400) {
              (paVar25->mNodeName).length = (ai_uint32)local_230._M_string_length;
              memcpy((paVar25->mNodeName).data,local_230._M_dataplus._M_p,local_230._M_string_length
                    );
              (paVar25->mNodeName).data[sVar15] = '\0';
            }
            uVar24 = (long)iVar14._M_current - (long)auVar41 >> 6;
            uVar39 = (uint)uVar24;
            paVar25->mNumPositionKeys = uVar39;
            paVar25->mNumRotationKeys = uVar39;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar24;
            uVar50 = SUB168(auVar7 * ZEXT816(0x18),0);
            paVar25->mNumScalingKeys = uVar39;
            if (SUB168(auVar7 * ZEXT816(0x18),8) != 0) {
              uVar50 = 0xffffffffffffffff;
            }
            paVar26 = (aiVectorKey *)operator_new__(uVar50);
            lVar20 = 0;
            do {
              puVar4 = (undefined8 *)((long)&paVar26->mTime + lVar20);
              *puVar4 = 0;
              puVar4[1] = 0;
              *(undefined4 *)((long)&(paVar26->mValue).z + lVar20) = 0;
              lVar20 = lVar20 + 0x18;
            } while (uVar24 * 0x18 != lVar20);
            paVar25->mPositionKeys = paVar26;
            paVar27 = (aiQuatKey *)operator_new__(uVar50);
            paVar34 = paVar27;
            do {
              paVar34->mTime = 0.0;
              (paVar34->mValue).w = 1.0;
              (paVar34->mValue).x = 0.0;
              (paVar34->mValue).y = 0.0;
              (paVar34->mValue).z = 0.0;
              paVar34 = paVar34 + 1;
            } while (paVar34 != paVar27 + uVar24);
            paVar25->mRotationKeys = paVar27;
            paVar26 = (aiVectorKey *)operator_new__(uVar50);
            lVar20 = 0;
            do {
              puVar4 = (undefined8 *)((long)&paVar26->mTime + lVar20);
              *puVar4 = 0;
              puVar4[1] = 0;
              *(undefined4 *)((long)&(paVar26->mValue).z + lVar20) = 0;
              lVar20 = lVar20 + 0x18;
            } while (uVar24 * 0x18 != lVar20);
            paVar25->mScalingKeys = paVar26;
            lVar20 = 8;
            lVar51 = 0;
            uVar50 = 0;
            do {
              local_1c8 = *(undefined1 (*) [8])((long)auVar41 + lVar51);
              paStack_1c0 = *(aiAnimation **)((char *)((long)auVar41 + lVar51) + 8);
              plVar2 = (long *)((long)auVar41 + lVar51 + 0x10);
              local_1b8 = (pointer)*plVar2;
              p_Stack_1b0 = (_Base_ptr)plVar2[1];
              local_1a8 = *(_Base_ptr *)((long)auVar41 + lVar51 + 0x20);
              p_Stack_1a0 = *(_Base_ptr *)((char *)((long)auVar41 + lVar51 + 0x20) + 8);
              psVar3 = (size_t *)((long)auVar41 + lVar51 + 0x30);
              local_198 = (pointer)*psVar3;
              sVar37 = psVar3[1];
              uStack_190._4_4_ = (float)(sVar37 >> 0x20);
              dVar8 = (double)uStack_190._4_4_;
              uStack_190._0_4_ = (float)sVar37;
              uStack_190 = (pointer)CONCAT44(0x3f800000,(float)uStack_190);
              *(double *)((long)*(aiVectorKey **)((long)local_378 + 0x408) + lVar20 + -8) = dVar8;
              *(double *)((long)*(aiQuatKey **)((long)local_378 + 0x418) + lVar20 + -8) = dVar8;
              *(double *)((long)*(aiVectorKey **)((long)local_378 + 0x428) + lVar20 + -8) = dVar8;
              aiMatrix4x4t<float>::Decompose
                        ((aiMatrix4x4t<float> *)local_1c8,
                         (aiVector3t<float> *)
                         ((long)&(*(aiVectorKey **)((long)local_378 + 0x428))->mTime + lVar20),
                         (aiQuaterniont<float> *)
                         ((long)&(*(aiQuatKey **)((long)local_378 + 0x418))->mTime + lVar20),
                         (aiVector3t<float> *)
                         ((long)&(*(aiVectorKey **)((long)local_378 + 0x408))->mTime + lVar20));
              uVar50 = uVar50 + 1;
              lVar20 = lVar20 + 0x18;
              lVar51 = lVar51 + 0x40;
              auVar41 = local_2c8;
            } while (uVar50 < (ulong)((long)iStack_2c0._M_current - (long)local_2c8 >> 6));
            if (aStack_2f0._M_allocated_capacity == aStack_2f0._8_8_) {
              std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
              _M_realloc_insert<aiNodeAnim*const&>
                        ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)&local_2f8,
                         (iterator)aStack_2f0._M_allocated_capacity,(aiNodeAnim **)local_378);
              pParser = local_2d8;
            }
            else {
              *(undefined1 (*) [8])aStack_2f0._M_allocated_capacity = local_378;
              aStack_2f0._M_allocated_capacity = aStack_2f0._M_allocated_capacity + 8;
              pParser = local_2d8;
            }
          }
          if ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             ((local_358.
               super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
               ._M_impl.super__Vector_impl_data._M_start)->mTimeAccessor->mCount != 0)) {
            local_1c8 = (undefined1  [8])0x0;
            paStack_1c0 = (aiAnimation *)0x0;
            local_1b8 = (pointer)0x0;
            psVar52 = &(local_358.
                        super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start)->mTargetId;
            do {
              if (((_Base_ptr)psVar52->_M_string_length != (_Base_ptr)0x0) &&
                 (lVar20 = std::__cxx11::string::find((char *)psVar52,0x695fed,0), lVar20 != -1)) {
                std::
                vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                ::push_back((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                             *)local_1c8,(value_type *)((long)(psVar52 + -1) + 0x18));
              }
              auVar41 = local_1c8;
              ppAVar11 = (Accessor **)(psVar52 + 3);
              psVar52 = (string *)((long)(psVar52 + 3) + 0x18);
            } while ((pointer)(ppAVar11 + 2) !=
                     local_358.
                     super__Vector_base<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
            if ((undefined1  [8])paStack_1c0 != local_1c8) {
              paVar28 = (aiMeshMorphAnim *)operator_new(0x410);
              (paVar28->mName).length = 0;
              (paVar28->mName).data[0] = '\0';
              memset((paVar28->mName).data + 1,0x1b,0x3ff);
              sVar15 = local_230._M_string_length;
              paVar28->mNumKeys = 0;
              paVar28->mKeys = (aiMeshMorphKey *)0x0;
              local_380 = paVar28;
              if (local_230._M_string_length < (pointer)0x400) {
                (paVar28->mName).length = (ai_uint32)local_230._M_string_length;
                memcpy((paVar28->mName).data,local_230._M_dataplus._M_p,local_230._M_string_length);
                (paVar28->mName).data[sVar15] = '\0';
              }
              local_378 = (undefined1  [8])0x0;
              pMStack_370 = (pointer)0x0;
              local_368[0] = (pointer)0x0;
              uVar39 = 0;
              do {
                cVar44 = SUB81(auVar41,0) + '\b';
                lVar20 = std::__cxx11::string::find(cVar44,0x28);
                lVar51 = std::__cxx11::string::find(cVar44,0x29);
                if ((lVar20 != -1) && (lVar51 != -1)) {
                  lVar20 = *(long *)((((aiAnimation *)auVar41)->mName).data + 0x5c);
                  lVar51 = *(long *)(lVar20 + 8);
                  if (*(long *)(lVar20 + 0x10) != lVar51) {
                    pCVar48 = (pointer)0x1;
                    pCVar42 = (pointer)0x0;
                    do {
                      pCVar38 = pCVar48;
                      lVar20 = *(long *)((((aiAnimation *)auVar41)->mName).data + 0x6c);
                      lVar6 = *(long *)(lVar20 + 8);
                      if ((pointer)(*(long *)(lVar20 + 0x10) - lVar6 >> 2) <= pCVar42) {
                        std::__throw_out_of_range_fmt
                                  (
                                  "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                  );
                        goto LAB_0040bd63;
                      }
                      insertMorphTimeValue
                                ((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>
                                  *)local_378,*(float *)(lVar51 + (long)pCVar42 * 4),
                                 *(float *)(lVar6 + (long)pCVar42 * 4),uVar39);
                      lVar20 = *(long *)((((aiAnimation *)auVar41)->mName).data + 0x5c);
                      lVar51 = *(long *)(lVar20 + 8);
                      pCVar48 = (pointer)(ulong)((int)pCVar38 + 1);
                      pCVar42 = pCVar38;
                    } while (pCVar38 < (pointer)(*(long *)(lVar20 + 0x10) - lVar51 >> 2));
                  }
                  uVar39 = uVar39 + 1;
                }
                paVar28 = local_380;
                auVar41 = (undefined1  [8])((((aiAnimation *)auVar41)->mName).data + 0x74);
              } while (auVar41 != (undefined1  [8])paStack_1c0);
              uVar50 = (long)pMStack_370 - (long)local_378 >> 5;
              local_380->mNumKeys = (uint)uVar50;
              uVar50 = uVar50 & 0xffffffff;
              puVar29 = (ulong *)operator_new__(uVar50 * 0x20 + 8);
              *puVar29 = uVar50;
              if (uVar50 != 0) {
                lVar20 = 0;
                do {
                  puVar4 = (undefined8 *)((long)puVar29 + lVar20 + 0x14);
                  *puVar4 = 0;
                  puVar4[1] = 0;
                  puVar4 = (undefined8 *)((long)&((aiMeshMorphKey *)(puVar29 + 1))->mTime + lVar20);
                  *puVar4 = 0;
                  puVar4[1] = 0;
                  lVar20 = lVar20 + 0x20;
                } while (uVar50 * 0x20 != lVar20);
              }
              paVar28->mKeys = (aiMeshMorphKey *)(puVar29 + 1);
              if (paVar28->mNumKeys != 0) {
                uVar39 = 0;
                auVar35 = local_1c8;
                do {
                  uVar24 = (ulong)uVar39;
                  paVar28->mKeys[uVar24].mNumValuesAndWeights =
                       (int)((ulong)((long)auVar41 - (long)auVar35) >> 3) * -0x11111111;
                  lVar20 = (long)paStack_1c0 - (long)local_1c8 >> 3;
                  puVar30 = (uint *)operator_new__(-(ulong)((ulong)(lVar20 * -0x1111111111111111) >>
                                                            0x3e != 0) |
                                                   lVar20 * -0x4444444444444444);
                  local_380->mKeys[uVar24].mValues = puVar30;
                  lVar20 = (long)paStack_1c0 - (long)local_1c8 >> 3;
                  uVar50 = lVar20 * 0x7777777777777778;
                  if (0x1fffffffffffffff < (ulong)(lVar20 * -0x1111111111111111)) {
                    uVar50 = 0xffffffffffffffff;
                  }
                  pdVar31 = (double *)operator_new__(uVar50);
                  local_380->mKeys[uVar24].mWeights = pdVar31;
                  local_380->mKeys[uVar24].mTime =
                       (double)*(float *)(((aiString *)local_378)->data + uVar24 * 0x20 + -4);
                  auVar35 = (undefined1  [8])paStack_1c0;
                  if ((undefined1  [8])paStack_1c0 != local_1c8) {
                    uVar50 = 0;
                    do {
                      uVar33 = (uint)uVar50;
                      local_380->mKeys[uVar24].mValues[uVar50] = uVar33;
                      lVar20 = *(long *)(((aiString *)local_378)->data +
                                        (long)(int)uVar39 * 0x20 + 4);
                      lVar51 = *(long *)(((aiString *)local_378)->data +
                                        (long)(int)uVar39 * 0x20 + 0xc) - lVar20;
                      dVar8 = 0.0;
                      if (lVar51 != 0) {
                        uVar45 = 1;
                        uVar43 = 0;
                        do {
                          if (*(uint *)(lVar20 + 4 + uVar43 * 8) == uVar33) {
                            dVar8 = (double)*(float *)(lVar20 + uVar43 * 8);
                            break;
                          }
                          uVar43 = (ulong)uVar45;
                          uVar45 = uVar45 + 1;
                          dVar8 = 0.0;
                        } while (uVar43 < (ulong)(lVar51 >> 3));
                      }
                      local_380->mKeys[uVar24].mWeights[uVar50] = dVar8;
                      uVar50 = (ulong)(uVar33 + 1);
                      uVar43 = ((long)paStack_1c0 - (long)local_1c8 >> 3) * -0x1111111111111111;
                      auVar35 = local_1c8;
                    } while (uVar50 <= uVar43 && uVar43 - uVar50 != 0);
                  }
                  uVar39 = uVar39 + 1;
                  paVar28 = local_380;
                  auVar41 = (undefined1  [8])paStack_1c0;
                } while (uVar39 < local_380->mNumKeys);
              }
              if ((ProgressHandler *)local_318._8_8_ == local_308) {
                std::vector<aiMeshMorphAnim*,std::allocator<aiMeshMorphAnim*>>::
                _M_realloc_insert<aiMeshMorphAnim*const&>
                          ((vector<aiMeshMorphAnim*,std::allocator<aiMeshMorphAnim*>> *)
                           local_318._M_local_buf,(iterator)local_318._8_8_,&local_380);
              }
              else {
                *(aiMeshMorphAnim **)local_318._8_8_ = paVar28;
                local_318._8_8_ = local_318._8_8_ + 8;
              }
              std::vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_>::
              ~vector((vector<Assimp::MorphTimeValues,_std::allocator<Assimp::MorphTimeValues>_> *)
                      local_378);
            }
            std::
            vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
            ~vector((vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>
                     *)local_1c8);
          }
          if (local_2c8 != (undefined1  [8])0x0) {
            operator_delete((void *)local_2c8,(long)local_2b8 - (long)local_2c8);
          }
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,CONCAT71(acStack_327._0_7_,local_328) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_p != &local_240) {
          operator_delete(local_250._M_p,
                          CONCAT71(local_240._M_allocated_capacity._1_7_,local_240._M_local_buf[0])
                          + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      std::vector<Assimp::Collada::ChannelEntry,_std::allocator<Assimp::Collada::ChannelEntry>_>::
      ~vector(&local_358);
      p_Var17 = (_Base_ptr)&local_1d0->_M_parent;
    } while (p_Var17 !=
             (_Base_ptr)
             local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (local_2f8 == (aiNodeAnim **)aStack_2f0._M_allocated_capacity) goto LAB_0040ba54;
    bVar9 = false;
  }
  uVar12 = aStack_2f0._M_allocated_capacity;
  __src = local_2f8;
  paVar32 = (aiAnimation *)operator_new(0x448);
  (paVar32->mName).length = 0;
  (paVar32->mName).data[0] = '\0';
  memset((paVar32->mName).data + 1,0x1b,0x3ff);
  paVar32->mDuration = -1.0;
  paVar32->mTicksPerSecond = 0.0;
  paVar32->mNumChannels = 0;
  paVar32->mChannels = (aiNodeAnim **)0x0;
  paVar32->mNumMeshChannels = 0;
  paVar32->mMeshChannels = (aiMeshAnim **)0x0;
  paVar32->mNumMorphMeshChannels = 0;
  paVar32->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  uVar50 = local_1d8->_M_string_length;
  local_1c8 = (undefined1  [8])paVar32;
  if (uVar50 < 0x400) {
    (paVar32->mName).length = (ai_uint32)uVar50;
    memcpy((paVar32->mName).data,(local_1d8->_M_dataplus)._M_p,uVar50);
    (paVar32->mName).data[uVar50] = '\0';
  }
  sVar18 = uVar12 - (long)__src;
  uVar39 = (uint)((long)sVar18 >> 3);
  paVar32->mNumChannels = uVar39;
  if (uVar39 != 0) {
    uVar50 = 0xffffffffffffffff;
    if ((ulong)((long)sVar18 >> 3) < 0x2000000000000000) {
      uVar50 = sVar18;
    }
    __dest = (aiNodeAnim **)operator_new__(uVar50);
    paVar32->mChannels = __dest;
    if (!bVar9) {
      memmove(__dest,__src,sVar18);
    }
  }
  uVar13 = local_318._8_8_;
  uVar12 = local_318._M_allocated_capacity;
  uVar50 = local_318._8_8_ - local_318._0_8_;
  uVar39 = (uint)(uVar50 >> 3);
  paVar32->mNumMorphMeshChannels = uVar39;
  if (uVar39 != 0) {
    __dest_00 = (aiMeshMorphAnim **)operator_new__(uVar50 & 0x7fffffff8);
    paVar32->mMorphMeshChannels = __dest_00;
    if (uVar13 != uVar12) {
      memmove(__dest_00,(void *)uVar12,uVar50);
    }
  }
  paVar32->mDuration = 0.0;
  if (aStack_2f0._M_allocated_capacity - (long)__src == 0) {
    uVar58 = 0;
    uVar59 = 0;
  }
  else {
    lVar20 = (long)(aStack_2f0._M_allocated_capacity - (long)__src) >> 3;
    uVar58 = 0;
    uVar59 = 0;
    lVar51 = 0;
    do {
      dVar8 = __src[lVar51]->mPositionKeys[__src[lVar51]->mNumPositionKeys - 1].mTime;
      uVar60 = SUB84(dVar8,0);
      uVar61 = (int)((ulong)dVar8 >> 0x20);
      if (dVar8 <= (double)CONCAT44(uVar59,uVar58)) {
        uVar60 = uVar58;
        uVar61 = uVar59;
      }
      paVar32->mDuration = (double)CONCAT44(uVar61,uVar60);
      dVar8 = __src[lVar51]->mRotationKeys[__src[lVar51]->mNumRotationKeys - 1].mTime;
      uVar62 = SUB84(dVar8,0);
      uVar63 = (int)((ulong)dVar8 >> 0x20);
      if (dVar8 <= (double)CONCAT44(uVar61,uVar60)) {
        uVar62 = uVar60;
        uVar63 = uVar61;
      }
      paVar32->mDuration = (double)CONCAT44(uVar63,uVar62);
      dVar8 = __src[lVar51]->mScalingKeys[__src[lVar51]->mNumScalingKeys - 1].mTime;
      uVar58 = SUB84(dVar8,0);
      uVar59 = (int)((ulong)dVar8 >> 0x20);
      if (dVar8 <= (double)CONCAT44(uVar63,uVar62)) {
        uVar58 = uVar62;
        uVar59 = uVar63;
      }
      paVar32->mDuration = (double)CONCAT44(uVar59,uVar58);
      lVar51 = lVar51 + 1;
    } while (lVar20 + (ulong)(lVar20 == 0) != lVar51);
  }
  if (uVar13 != uVar12) {
    lVar20 = 0;
    do {
      paVar28 = *(aiMeshMorphAnim **)(uVar12 + lVar20 * 8);
      dVar8 = paVar28->mKeys[paVar28->mNumKeys - 1].mTime;
      uVar60 = SUB84(dVar8,0);
      uVar61 = (int)((ulong)dVar8 >> 0x20);
      if (dVar8 <= (double)CONCAT44(uVar59,uVar58)) {
        uVar60 = uVar58;
        uVar61 = uVar59;
      }
      uVar59 = uVar61;
      uVar58 = uVar60;
      paVar32->mDuration = (double)CONCAT44(uVar59,uVar58);
      lVar20 = lVar20 + 1;
    } while (((long)uVar50 >> 3) + (ulong)((long)uVar50 >> 3 == 0) != lVar20);
  }
  paVar32->mTicksPerSecond = 1.0;
  __position._M_current =
       (local_210->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (local_210->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiAnimation*,std::allocator<aiAnimation*>>::_M_realloc_insert<aiAnimation*const&>
              ((vector<aiAnimation*,std::allocator<aiAnimation*>> *)&local_210->mAnims,__position,
               (aiAnimation **)local_1c8);
  }
  else {
    *__position._M_current = paVar32;
    pppaVar1 = &(local_210->mAnims).
                super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
LAB_0040bcf4:
  if ((aiMeshMorphAnim **)local_318._M_allocated_capacity != (aiMeshMorphAnim **)0x0) {
    operator_delete((void *)local_318._M_allocated_capacity,(long)local_308 - local_318._0_8_);
  }
  if (local_2f8 != (aiNodeAnim **)0x0) {
    operator_delete(local_2f8,aStack_2f0._8_8_ - (long)local_2f8);
  }
  if ((_Base_ptr)
      local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_1f8.super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f8.
                          super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.
                          super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ColladaLoader::CreateAnimation(aiScene* pScene, const ColladaParser& pParser, const Collada::Animation* pSrcAnim, const std::string& pName)
{
    // collect a list of animatable nodes
    std::vector<const aiNode*> nodes;
    CollectNodes(pScene->mRootNode, nodes);

    std::vector<aiNodeAnim*> anims;
    std::vector<aiMeshMorphAnim*> morphAnims;

    for (std::vector<const aiNode*>::const_iterator nit = nodes.begin(); nit != nodes.end(); ++nit)
    {
        // find all the collada anim channels which refer to the current node
        std::vector<Collada::ChannelEntry> entries;
        std::string nodeName = (*nit)->mName.data;

        // find the collada node corresponding to the aiNode
        const Collada::Node* srcNode = FindNode(pParser.mRootNode, nodeName);
        //      ai_assert( srcNode != NULL);
        if (!srcNode)
            continue;

        // now check all channels if they affect the current node
        std::string targetID, subElement;
        for (std::vector<Collada::AnimationChannel>::const_iterator cit = pSrcAnim->mChannels.begin();
            cit != pSrcAnim->mChannels.end(); ++cit)
        {
            const Collada::AnimationChannel& srcChannel = *cit;
            Collada::ChannelEntry entry;

            // we expect the animation target to be of type "nodeName/transformID.subElement". Ignore all others
            // find the slash that separates the node name - there should be only one
            std::string::size_type slashPos = srcChannel.mTarget.find('/');
            if (slashPos == std::string::npos)
            {
                std::string::size_type targetPos = srcChannel.mTarget.find(srcNode->mID);
                if (targetPos == std::string::npos)
                    continue;

                // not node transform, but something else. store as unknown animation channel for now
                entry.mChannel = &(*cit);
                entry.mTargetId = srcChannel.mTarget.substr(targetPos + pSrcAnim->mName.length(),
                    srcChannel.mTarget.length() - targetPos - pSrcAnim->mName.length());
                if (entry.mTargetId.front() == '-')
                    entry.mTargetId = entry.mTargetId.substr(1);
                entries.push_back(entry);
                continue;
            }
            if (srcChannel.mTarget.find('/', slashPos + 1) != std::string::npos)
                continue;

            targetID.clear();
            targetID = srcChannel.mTarget.substr(0, slashPos);
            if (targetID != srcNode->mID)
                continue;

            // find the dot that separates the transformID - there should be only one or zero
            std::string::size_type dotPos = srcChannel.mTarget.find('.');
            if (dotPos != std::string::npos)
            {
                if (srcChannel.mTarget.find('.', dotPos + 1) != std::string::npos)
                    continue;

                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, dotPos - slashPos - 1);

                subElement.clear();
                subElement = srcChannel.mTarget.substr(dotPos + 1);
                if (subElement == "ANGLE")
                    entry.mSubElement = 3; // last number in an Axis-Angle-Transform is the angle
                else if (subElement == "X")
                    entry.mSubElement = 0;
                else if (subElement == "Y")
                    entry.mSubElement = 1;
                else if (subElement == "Z")
                    entry.mSubElement = 2;
                else
                    ASSIMP_LOG_WARN_F("Unknown anim subelement <", subElement, ">. Ignoring");
            }
            else {
                // no subelement following, transformId is remaining string
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1);
            }

            std::string::size_type bracketPos = srcChannel.mTarget.find('(');
            if (bracketPos != std::string::npos)
            {
                entry.mTransformId = srcChannel.mTarget.substr(slashPos + 1, bracketPos - slashPos - 1);
                subElement.clear();
                subElement = srcChannel.mTarget.substr(bracketPos);

                if (subElement == "(0)(0)")
                    entry.mSubElement = 0;
                else if (subElement == "(1)(0)")
                    entry.mSubElement = 1;
                else if (subElement == "(2)(0)")
                    entry.mSubElement = 2;
                else if (subElement == "(3)(0)")
                    entry.mSubElement = 3;
                else if (subElement == "(0)(1)")
                    entry.mSubElement = 4;
                else if (subElement == "(1)(1)")
                    entry.mSubElement = 5;
                else if (subElement == "(2)(1)")
                    entry.mSubElement = 6;
                else if (subElement == "(3)(1)")
                    entry.mSubElement = 7;
                else if (subElement == "(0)(2)")
                    entry.mSubElement = 8;
                else if (subElement == "(1)(2)")
                    entry.mSubElement = 9;
                else if (subElement == "(2)(2)")
                    entry.mSubElement = 10;
                else if (subElement == "(3)(2)")
                    entry.mSubElement = 11;
                else if (subElement == "(0)(3)")
                    entry.mSubElement = 12;
                else if (subElement == "(1)(3)")
                    entry.mSubElement = 13;
                else if (subElement == "(2)(3)")
                    entry.mSubElement = 14;
                else if (subElement == "(3)(3)")
                    entry.mSubElement = 15;
            }

            // determine which transform step is affected by this channel
            entry.mTransformIndex = SIZE_MAX;
            for (size_t a = 0; a < srcNode->mTransforms.size(); ++a)
                if (srcNode->mTransforms[a].mID == entry.mTransformId)
                    entry.mTransformIndex = a;

            if (entry.mTransformIndex == SIZE_MAX)
            {
                if (entry.mTransformId.find("morph-weights") != std::string::npos)
                {
                    entry.mTargetId = entry.mTransformId;
                    entry.mTransformId = "";
                }
                else
                    continue;
            }

            entry.mChannel = &(*cit);
            entries.push_back(entry);
        }

        // if there's no channel affecting the current node, we skip it
        if (entries.empty())
            continue;

        // resolve the data pointers for all anim channels. Find the minimum time while we're at it
        ai_real startTime = ai_real(1e20), endTime = ai_real(-1e20);
        for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
        {
            Collada::ChannelEntry& e = *it;
            e.mTimeAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceTimes);
            e.mTimeData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mTimeAccessor->mSource);
            e.mValueAccessor = &pParser.ResolveLibraryReference(pParser.mAccessorLibrary, e.mChannel->mSourceValues);
            e.mValueData = &pParser.ResolveLibraryReference(pParser.mDataLibrary, e.mValueAccessor->mSource);

            // time count and value count must match
            if (e.mTimeAccessor->mCount != e.mValueAccessor->mCount)
                throw DeadlyImportError(format() << "Time count / value count mismatch in animation channel \"" << e.mChannel->mTarget << "\".");

            if (e.mTimeAccessor->mCount > 0)
            {
                // find bounding times
                startTime = std::min(startTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, 0, 0));
                endTime = std::max(endTime, ReadFloat(*e.mTimeAccessor, *e.mTimeData, e.mTimeAccessor->mCount - 1, 0));
            }
        }

        std::vector<aiMatrix4x4> resultTrafos;
        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            // create a local transformation chain of the node's transforms
            std::vector<Collada::Transform> transforms = srcNode->mTransforms;

            // now for every unique point in time, find or interpolate the key values for that time
            // and apply them to the transform chain. Then the node's present transformation can be calculated.
            ai_real time = startTime;
            while (1)
            {
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;

                    // find the keyframe behind the current point in time
                    size_t pos = 0;
                    ai_real postTime = 0.0;
                    while (1)
                    {
                        if (pos >= e.mTimeAccessor->mCount)
                            break;
                        postTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos, 0);
                        if (postTime >= time)
                            break;
                        ++pos;
                    }

                    pos = std::min(pos, e.mTimeAccessor->mCount - 1);

                    // read values from there
                    ai_real temp[16];
                    for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        temp[c] = ReadFloat(*e.mValueAccessor, *e.mValueData, pos, c);

                    // if not exactly at the key time, interpolate with previous value set
                    if (postTime > time && pos > 0)
                    {
                        ai_real preTime = ReadFloat(*e.mTimeAccessor, *e.mTimeData, pos - 1, 0);
                        ai_real factor = (time - postTime) / (preTime - postTime);

                        for (size_t c = 0; c < e.mValueAccessor->mSize; ++c)
                        {
                            ai_real v = ReadFloat(*e.mValueAccessor, *e.mValueData, pos - 1, c);
                            temp[c] += (v - temp[c]) * factor;
                        }
                    }

                    // Apply values to current transformation
                    std::copy(temp, temp + e.mValueAccessor->mSize, transforms[e.mTransformIndex].f + e.mSubElement);
                }

                // Calculate resulting transformation
                aiMatrix4x4 mat = pParser.CalculateResultTransform(transforms);

                // out of laziness: we store the time in matrix.d4
                mat.d4 = time;
                resultTrafos.push_back(mat);

                // find next point in time to evaluate. That's the closest frame larger than the current in any channel
                ai_real nextTime = ai_real(1e20);
                for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
                {
                    Collada::ChannelEntry& channelElement = *it;

                    // find the next time value larger than the current
                    size_t pos = 0;
                    while (pos < channelElement.mTimeAccessor->mCount)
                    {
                        const ai_real t = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        if (t > time)
                        {
                            nextTime = std::min(nextTime, t);
                            break;
                        }
                        ++pos;
                    }

                    // https://github.com/assimp/assimp/issues/458
                    // Sub-sample axis-angle channels if the delta between two consecutive
                    // key-frame angles is >= 180 degrees.
                    if (transforms[channelElement.mTransformIndex].mType == Collada::TF_ROTATE && channelElement.mSubElement == 3 && pos > 0 && pos < channelElement.mTimeAccessor->mCount) {
                        const ai_real cur_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos, 0);
                        const ai_real last_key_angle = ReadFloat(*channelElement.mValueAccessor, *channelElement.mValueData, pos - 1, 0);
                        const ai_real cur_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos, 0);
                        const ai_real last_key_time = ReadFloat(*channelElement.mTimeAccessor, *channelElement.mTimeData, pos - 1, 0);
                        const ai_real last_eval_angle = last_key_angle + (cur_key_angle - last_key_angle) * (time - last_key_time) / (cur_key_time - last_key_time);
                        const ai_real delta = std::abs(cur_key_angle - last_eval_angle);
                        if (delta >= 180.0) {
                            const int subSampleCount = static_cast<int>(std::floor(delta / 90.0));
                            if (cur_key_time != time) {
                                const ai_real nextSampleTime = time + (cur_key_time - time) / subSampleCount;
                                nextTime = std::min(nextTime, nextSampleTime);
                            }
                        }
                    }
                }

                // no more keys on any channel after the current time -> we're done
                if (nextTime > 1e19)
                    break;

                // else construct next keyframe at this following time point
                time = nextTime;
            }
        }

        // there should be some keyframes, but we aren't that fixated on valid input data
//      ai_assert( resultTrafos.size() > 0);

        // build an animation channel for the given node out of these trafo keys
        if (!resultTrafos.empty())
        {
            aiNodeAnim* dstAnim = new aiNodeAnim;
            dstAnim->mNodeName = nodeName;
            dstAnim->mNumPositionKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumRotationKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mNumScalingKeys = static_cast<unsigned int>(resultTrafos.size());
            dstAnim->mPositionKeys = new aiVectorKey[resultTrafos.size()];
            dstAnim->mRotationKeys = new aiQuatKey[resultTrafos.size()];
            dstAnim->mScalingKeys = new aiVectorKey[resultTrafos.size()];

            for (size_t a = 0; a < resultTrafos.size(); ++a)
            {
                aiMatrix4x4 mat = resultTrafos[a];
                double time = double(mat.d4); // remember? time is stored in mat.d4
                mat.d4 = 1.0f;

                dstAnim->mPositionKeys[a].mTime = time;
                dstAnim->mRotationKeys[a].mTime = time;
                dstAnim->mScalingKeys[a].mTime = time;
                mat.Decompose(dstAnim->mScalingKeys[a].mValue, dstAnim->mRotationKeys[a].mValue, dstAnim->mPositionKeys[a].mValue);
            }

            anims.push_back(dstAnim);
        }
        else
        {
            ASSIMP_LOG_WARN("Collada loader: found empty animation channel, ignored. Please check your exporter.");
        }

        if (!entries.empty() && entries.front().mTimeAccessor->mCount > 0)
        {
            std::vector<Collada::ChannelEntry> morphChannels;
            for (std::vector<Collada::ChannelEntry>::iterator it = entries.begin(); it != entries.end(); ++it)
            {
                Collada::ChannelEntry& e = *it;

                // skip non-transform types
                if (e.mTargetId.empty())
                    continue;

                if (e.mTargetId.find("morph-weights") != std::string::npos)
                    morphChannels.push_back(e);
            }
            if (morphChannels.size() > 0)
            {
                // either 1) morph weight animation count should contain morph target count channels
                // or     2) one channel with morph target count arrays
                // assume first

                aiMeshMorphAnim *morphAnim = new aiMeshMorphAnim;
                morphAnim->mName.Set(nodeName);

                std::vector<MorphTimeValues> morphTimeValues;

                int morphAnimChannelIndex = 0;
                for (std::vector<Collada::ChannelEntry>::iterator it = morphChannels.begin(); it != morphChannels.end(); ++it)
                {
                    Collada::ChannelEntry& e = *it;
                    std::string::size_type apos = e.mTargetId.find('(');
                    std::string::size_type bpos = e.mTargetId.find(')');
                    if (apos == std::string::npos || bpos == std::string::npos)
                        // unknown way to specify weight -> ignore this animation
                        continue;

                    // weight target can be in format Weight_M_N, Weight_N, WeightN, or some other way
                    // we ignore the name and just assume the channels are in the right order
                    for (unsigned int i = 0; i < e.mTimeData->mValues.size(); i++)
                        insertMorphTimeValue(morphTimeValues, e.mTimeData->mValues.at(i), e.mValueData->mValues.at(i), morphAnimChannelIndex);

                    ++morphAnimChannelIndex;
                }

                morphAnim->mNumKeys = static_cast<unsigned int>(morphTimeValues.size());
                morphAnim->mKeys = new aiMeshMorphKey[morphAnim->mNumKeys];
                for (unsigned int key = 0; key < morphAnim->mNumKeys; key++)
                {
                    morphAnim->mKeys[key].mNumValuesAndWeights = static_cast<unsigned int>(morphChannels.size());
                    morphAnim->mKeys[key].mValues = new unsigned int[morphChannels.size()];
                    morphAnim->mKeys[key].mWeights = new double[morphChannels.size()];

                    morphAnim->mKeys[key].mTime = morphTimeValues[key].mTime;
                    for (unsigned int valueIndex = 0; valueIndex < morphChannels.size(); valueIndex++)
                    {
                        morphAnim->mKeys[key].mValues[valueIndex] = valueIndex;
                        morphAnim->mKeys[key].mWeights[valueIndex] = getWeightAtKey(morphTimeValues, key, valueIndex);
                    }
                }

                morphAnims.push_back(morphAnim);
            }
        }
    }

    if (!anims.empty() || !morphAnims.empty())
    {
        aiAnimation* anim = new aiAnimation;
        anim->mName.Set(pName);
        anim->mNumChannels = static_cast<unsigned int>(anims.size());
        if (anim->mNumChannels > 0)
        {
            anim->mChannels = new aiNodeAnim*[anims.size()];
            std::copy(anims.begin(), anims.end(), anim->mChannels);
        }
        anim->mNumMorphMeshChannels = static_cast<unsigned int>(morphAnims.size());
        if (anim->mNumMorphMeshChannels > 0)
        {
            anim->mMorphMeshChannels = new aiMeshMorphAnim*[anim->mNumMorphMeshChannels];
            std::copy(morphAnims.begin(), morphAnims.end(), anim->mMorphMeshChannels);
        }
        anim->mDuration = 0.0f;
        for (size_t a = 0; a < anims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, anims[a]->mPositionKeys[anims[a]->mNumPositionKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mRotationKeys[anims[a]->mNumRotationKeys - 1].mTime);
            anim->mDuration = std::max(anim->mDuration, anims[a]->mScalingKeys[anims[a]->mNumScalingKeys - 1].mTime);
        }
        for (size_t a = 0; a < morphAnims.size(); ++a)
        {
            anim->mDuration = std::max(anim->mDuration, morphAnims[a]->mKeys[morphAnims[a]->mNumKeys - 1].mTime);
        }
        anim->mTicksPerSecond = 1;
        mAnims.push_back(anim);
    }
}